

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O0

int __thiscall ncnn::Proposal::load_param(Proposal *this,ParamDict *pd)

{
  int iVar1;
  ParamDict *in_RSI;
  Mat *in_RDI;
  float fVar2;
  Mat *unaff_retaddr;
  int in_stack_0000000c;
  undefined4 in_stack_ffffffffffffff80;
  int def;
  Mat *scales;
  
  def = 0x10;
  scales = in_RDI;
  iVar1 = ParamDict::get(in_RSI,0,0x10);
  *(int *)&in_RDI[2].cstep = iVar1;
  iVar1 = ParamDict::get(in_RSI,1,def);
  *(int *)((long)&in_RDI[2].cstep + 4) = iVar1;
  iVar1 = ParamDict::get(in_RSI,2,6000);
  *(int *)&in_RDI[3].data = iVar1;
  iVar1 = ParamDict::get(in_RSI,3,300);
  *(int *)((long)&in_RDI[3].data + 4) = iVar1;
  fVar2 = ParamDict::get(in_RSI,4,(float)0x3f333333);
  *(float *)&in_RDI[3].refcount = fVar2;
  iVar1 = ParamDict::get(in_RSI,5,def);
  *(int *)((long)&in_RDI[3].refcount + 4) = iVar1;
  generate_anchors(in_stack_0000000c,unaff_retaddr,scales);
  ncnn::Mat::operator=(in_RDI,(Mat *)CONCAT44(def,in_stack_ffffffffffffff80));
  ncnn::Mat::~Mat((Mat *)0x4d388f);
  return 0;
}

Assistant:

int Proposal::load_param(const ParamDict& pd)
{
    feat_stride = pd.get(0, 16);
    base_size = pd.get(1, 16);
    pre_nms_topN = pd.get(2, 6000);
    after_nms_topN = pd.get(3, 300);
    nms_thresh = pd.get(4, 0.7f);
    min_size = pd.get(5, 16);

    //     Mat ratio;
    //     Mat scale;

    anchors = generate_anchors(base_size, ratios, scales);

    return 0;
}